

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O1

bool __thiscall glu::ES2ContextInfo::isFragmentDynamicLoopSupported(ES2ContextInfo *this)

{
  bool bVar1;
  
  if ((this->m_fragmentDynamicLoopsSupported).m_isComputed == false) {
    bVar1 = TryCompileProgram::operator()
                      (&(this->m_fragmentDynamicLoopsSupported).m_compute,
                       (this->super_ContextInfo).m_context);
    (this->m_fragmentDynamicLoopsSupported).m_value = bVar1;
    (this->m_fragmentDynamicLoopsSupported).m_isComputed = true;
  }
  return (this->m_fragmentDynamicLoopsSupported).m_value;
}

Assistant:

bool								isFragmentDynamicLoopSupported		(void) const	{ return m_fragmentDynamicLoopsSupported.getValue(m_context);	}